

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O0

void __thiscall
duckdb::WindowSegmentTreePart::EvaluateLeaves
          (WindowSegmentTreePart *this,WindowSegmentTreeGlobalState *tree,idx_t *begins,idx_t *ends,
          idx_t *bounds,idx_t count,idx_t row_idx,FramePart frame_part,FramePart leaf_part)

{
  char cVar1;
  uchar **ppuVar2;
  idx_t *piVar3;
  idx_t *piVar4;
  data_ptr_t begin_00;
  data_ptr_t state_ptr_00;
  idx_t *in_RCX;
  idx_t *in_RDX;
  long in_RSI;
  idx_t *in_R8;
  ulong in_R9;
  bool bVar5;
  bool bVar6;
  WindowSegmentTreePart *in_stack_00000008;
  FramePart in_stack_00000010;
  char in_stack_00000018;
  idx_t group_end;
  idx_t group_begin;
  idx_t parent_end;
  idx_t parent_begin;
  unsigned_long end;
  idx_t frame_end;
  unsigned_long begin;
  idx_t frame_begin;
  uchar *state_ptr;
  idx_t cur_row;
  idx_t rid;
  idx_t *frame_ends;
  idx_t *frame_begins;
  bool add_curr_row;
  bool end_on_curr_row;
  bool begin_on_curr_row;
  WindowExcludeMode exclude_mode;
  bool compute_right;
  bool compute_left;
  uchar **fdata;
  WindowSegmentTreePart *local_d0;
  undefined1 *local_c8;
  WindowSegmentTreePart *in_stack_ffffffffffffff68;
  WindowSegmentTreePart *in_stack_ffffffffffffff70;
  WindowSegmentTreePart *b;
  WindowSegmentTreePart *b_00;
  WindowSegmentTreeGlobalState *tree_00;
  ulong local_58;
  
  ppuVar2 = FlatVector::GetData<unsigned_char*>((Vector *)0x1a45306);
  bVar5 = in_stack_00000018 != '\x02';
  cVar1 = *(char *)(*(long *)(in_RSI + 0x210) + 0x1a8);
  bVar6 = false;
  if ((bVar5) && (bVar6 = false, in_stack_00000010 == RIGHT)) {
    bVar6 = cVar1 == '\x03';
  }
  piVar3 = FrameBegins(in_RDX,in_RCX,in_R8,in_stack_00000010);
  piVar4 = FrameEnds(in_RDX,in_RCX,in_R8,in_stack_00000010);
  for (local_58 = 0; local_58 < in_R9; local_58 = local_58 + 1) {
    tree_00 = (WindowSegmentTreeGlobalState *)ppuVar2[local_58];
    b_00 = (WindowSegmentTreePart *)piVar3[local_58];
    if (in_stack_00000010 == RIGHT && cVar1 == '\x01') {
      local_c8 = (undefined1 *)((long)&in_stack_00000008->allocator + 1);
    }
    else {
      local_c8 = (undefined1 *)in_RDX[local_58];
    }
    begin_00 = (data_ptr_t)MaxValue<unsigned_long>((unsigned_long)local_c8,(unsigned_long)b_00);
    b = (WindowSegmentTreePart *)piVar4[local_58];
    local_d0 = in_stack_00000008;
    if (in_stack_00000010 != LEFT || cVar1 != '\x01') {
      local_d0 = (WindowSegmentTreePart *)in_RCX[local_58];
    }
    state_ptr_00 = (data_ptr_t)MinValue<unsigned_long>((unsigned_long)local_d0,(unsigned_long)b);
    if (((bVar6) && (b_00 <= in_stack_00000008)) && (in_stack_00000008 < b)) {
      WindowSegmentValue(in_stack_00000008,tree_00,(idx_t)b_00,(idx_t)begin_00,(idx_t)b,state_ptr_00
                        );
    }
    if (begin_00 < state_ptr_00) {
      in_stack_ffffffffffffff70 = (WindowSegmentTreePart *)((ulong)begin_00 >> 4);
      in_stack_ffffffffffffff68 = (WindowSegmentTreePart *)((ulong)state_ptr_00 >> 4);
      if (in_stack_ffffffffffffff70 == in_stack_ffffffffffffff68) {
        if (bVar5) {
          WindowSegmentValue(in_stack_00000008,tree_00,(idx_t)b_00,(idx_t)begin_00,(idx_t)b,
                             state_ptr_00);
        }
      }
      else {
        if ((begin_00 != (data_ptr_t)((long)in_stack_ffffffffffffff70 << 4)) && (bVar5)) {
          WindowSegmentValue(in_stack_00000008,tree_00,(idx_t)b_00,(idx_t)begin_00,(idx_t)b,
                             state_ptr_00);
        }
        if ((state_ptr_00 != (data_ptr_t)((long)in_stack_ffffffffffffff68 << 4)) &&
           (in_stack_00000018 != '\x01')) {
          WindowSegmentValue(in_stack_00000008,tree_00,(idx_t)b_00,(idx_t)begin_00,(idx_t)b,
                             state_ptr_00);
        }
      }
    }
    in_stack_00000008 = (WindowSegmentTreePart *)((long)&in_stack_00000008->allocator + 1);
  }
  FlushStates(in_stack_ffffffffffffff70,SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  return;
}

Assistant:

void WindowSegmentTreePart::EvaluateLeaves(const WindowSegmentTreeGlobalState &tree, const idx_t *begins,
                                           const idx_t *ends, const idx_t *bounds, idx_t count, idx_t row_idx,
                                           FramePart frame_part, FramePart leaf_part) {

	auto fdata = FlatVector::GetData<data_ptr_t>(statef);

	// For order-sensitive aggregates, we have to process the ragged leaves in two pieces.
	// The left side have to be added before the main tree followed by the ragged right sides.
	// The current row is the leftmost value of the right hand side.
	const bool compute_left = leaf_part != FramePart::RIGHT;
	const bool compute_right = leaf_part != FramePart::LEFT;
	const auto exclude_mode = tree.tree.exclude_mode;
	const bool begin_on_curr_row = frame_part == FramePart::RIGHT && exclude_mode == WindowExcludeMode::CURRENT_ROW;
	const bool end_on_curr_row = frame_part == FramePart::LEFT && exclude_mode == WindowExcludeMode::CURRENT_ROW;
	// with EXCLUDE TIES, in addition to the frame part right of the peer group's end, we also need to consider the
	// current row
	const bool add_curr_row = compute_left && frame_part == FramePart::RIGHT && exclude_mode == WindowExcludeMode::TIES;

	// We need the full range of the frame to clamp
	auto frame_begins = FrameBegins(begins, ends, bounds, frame_part);
	auto frame_ends = FrameEnds(begins, ends, bounds, frame_part);

	for (idx_t rid = 0, cur_row = row_idx; rid < count; ++rid, ++cur_row) {
		auto state_ptr = fdata[rid];

		const auto frame_begin = frame_begins[rid];
		auto begin = MaxValue(begin_on_curr_row ? cur_row + 1 : begins[rid], frame_begin);

		const auto frame_end = frame_ends[rid];
		auto end = MinValue(end_on_curr_row ? cur_row : ends[rid], frame_end);
		if (add_curr_row && frame_begin <= cur_row && cur_row < frame_end) {
			WindowSegmentValue(tree, 0, cur_row, cur_row + 1, state_ptr);
		}
		if (begin >= end) {
			continue;
		}

		idx_t parent_begin = begin / tree.TREE_FANOUT;
		idx_t parent_end = end / tree.TREE_FANOUT;
		if (parent_begin == parent_end) {
			if (compute_left) {
				WindowSegmentValue(tree, 0, begin, end, state_ptr);
			}
			continue;
		}

		idx_t group_begin = parent_begin * tree.TREE_FANOUT;
		if (begin != group_begin && compute_left) {
			WindowSegmentValue(tree, 0, begin, group_begin + tree.TREE_FANOUT, state_ptr);
		}
		idx_t group_end = parent_end * tree.TREE_FANOUT;
		if (end != group_end && compute_right) {
			WindowSegmentValue(tree, 0, group_end, end, state_ptr);
		}
	}
	FlushStates(false);
}